

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O1

void labpack_write_object_bytes(labpack_writer_t *writer,char *data,size_t size)

{
  mpack_error_t error;
  char *pcVar1;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x161,"void labpack_write_object_bytes(labpack_writer_t *, const char *, size_t)"
                 );
  }
  if (writer->status == LABPACK_STATUS_OK) {
    if (size == 0 || data != (char *)0x0) {
      mpack_write_object_bytes(writer->encoder,data,size);
      error = writer->encoder->error;
      if (error == mpack_ok) {
        return;
      }
      writer->status = LABPACK_STATUS_ERROR_ENCODER;
      pcVar1 = labpack_mpack_error_message(error);
    }
    else {
      writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
      pcVar1 = "The MessagePack object data is NULL but the size is not zero";
    }
    writer->status_message = pcVar1;
  }
  return;
}

Assistant:

void
labpack_write_object_bytes(labpack_writer_t* writer, const char* data, size_t size)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!data && size > 0) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = "The MessagePack object data is NULL but the size is not zero";
            return;
        }
        mpack_write_object_bytes(writer->encoder, data, size);
        labpack_writer_check_encoder(writer);
    }
}